

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::
Table<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry,_kj::HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>_>
::insert(Table<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry,_kj::HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  Entry *pEVar2;
  RemoveConst<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> *pRVar3
  ;
  RawBrandedSchema *pRVar4;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,this,(long)(this->rows).builder.pos - (long)(this->rows).builder.ptr >> 4,row,
             0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pEVar1 = (this->rows).builder.endPtr;
    if ((this->rows).builder.pos == pEVar1) {
      pEVar2 = (this->rows).builder.ptr;
      newSize = 4;
      if (pEVar1 != pEVar2) {
        newSize = (long)pEVar1 - (long)pEVar2 >> 3;
      }
      Vector<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>::
      setCapacity(&this->rows,newSize);
    }
    pRVar3 = (this->rows).builder.pos;
    pRVar4 = row->value;
    pRVar3->key = row->key;
    pRVar3->value = pRVar4;
    pEVar1 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar1 + 1;
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}